

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Abc_Cex_t * Saig_BmcGenerateCounterExample(Saig_Bmc_t *p)

{
  uint ivar;
  Vec_Int_t *p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Abc_Cex_t *p_01;
  Aig_Man_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int Fill;
  long lVar6;
  
  p_01 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->iFrameFail + 1);
  iVar3 = p->iFrameFail;
  p_01->iFrame = iVar3;
  p_01->iPo = p->iOutputFail;
  if (-1 < iVar3) {
    iVar3 = 0;
    do {
      pAVar4 = p->pAig;
      if (0 < pAVar4->nTruePis) {
        lVar6 = 0;
        do {
          if (pAVar4->vCis->nSize <= lVar6) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pAVar5 = Saig_BmcObjFrame(p,(Aig_Obj_t *)pAVar4->vCis->pArray[lVar6],iVar3);
          if (pAVar5 != (Aig_Obj_t *)0x0) {
            p_00 = p->vObj2Var;
            iVar2 = pAVar5->Id;
            Vec_IntFillExtra(p_00,iVar2 + 1,Fill);
            if (((long)iVar2 < 0) || (p_00->nSize <= iVar2)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            ivar = p_00->pArray[iVar2];
            if ((ulong)ivar != 0) {
              if (p->pSat2 == (satoko_t *)0x0) {
                if (((int)ivar < 0) || (p->pSat->size <= (int)ivar)) {
                  __assert_fail("v >= 0 && v < s->size",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                                ,0xda,"int sat_solver_var_value(sat_solver *, int)");
                }
                if (p->pSat->model[ivar] == 1) goto LAB_0055c527;
              }
              else {
                iVar2 = satoko_read_cex_varvalue(p->pSat2,ivar);
                if (iVar2 != 0) {
LAB_0055c527:
                  iVar2 = p->pAig->nTruePis * iVar3 + p_01->nRegs + (int)lVar6;
                  (&p_01[1].iPo)[iVar2 >> 5] =
                       (&p_01[1].iPo)[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
                }
              }
            }
          }
          lVar6 = lVar6 + 1;
          pAVar4 = p->pAig;
        } while (lVar6 < pAVar4->nTruePis);
      }
      bVar1 = iVar3 < p->iFrameFail;
      iVar3 = iVar3 + 1;
    } while (bVar1);
  }
  iVar3 = Saig_ManVerifyCex(p->pAig,p_01);
  if (iVar3 == 0) {
    puts("Saig_BmcGenerateCounterExample(): Counter-example is invalid.");
    Abc_CexFree(p_01);
    p_01 = (Abc_Cex_t *)0x0;
  }
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_BmcGenerateCounterExample( Saig_Bmc_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj, * pObjFrm;
    int i, f, iVarNum;
    // start the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), p->iFrameFail+1 );
    pCex->iFrame = p->iFrameFail;
    pCex->iPo    = p->iOutputFail;
    // copy the bit data
    for ( f = 0; f <= p->iFrameFail; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFrm = Saig_BmcObjFrame( p, pObj, f );
            if ( pObjFrm == NULL )
                continue;
            iVarNum = Saig_BmcSatNum( p, pObjFrm );
            if ( iVarNum == 0 )
                continue;
            if ( p->pSat2 ? satoko_read_cex_varvalue(p->pSat2, iVarNum) : sat_solver_var_value(p->pSat, iVarNum) )
                Abc_InfoSetBit( pCex->pData, pCex->nRegs + Saig_ManPiNum(p->pAig) * f + i );
        }
    }
    // verify the counter example
    if ( !Saig_ManVerifyCex( p->pAig, pCex ) )
    {
        printf( "Saig_BmcGenerateCounterExample(): Counter-example is invalid.\n" );
        Abc_CexFree( pCex );
        pCex = NULL;
    }
    return pCex;
}